

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_greaterThan_vec2(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  
  fVar1 = c->in[1].m_data[0];
  fVar2 = c->in[0].m_data[1];
  (c->color).m_data[1] = (float)(-(uint)(c->in[1].m_data[1] < c->in[0].m_data[3]) & 0x3f800000);
  (c->color).m_data[2] = (float)(-(uint)(fVar1 < fVar2) & 0x3f800000);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }